

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O3

void __thiscall crypto_tests::CryptoTest::TestSHA256(CryptoTest *this,string *in,string *hexout)

{
  long in_FS_OFFSET;
  string_view hex_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  CSHA256 local_90;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&local_90);
  hex_str._M_str = (hexout->_M_dataplus)._M_p;
  hex_str._M_len = hexout->_M_string_length;
  ParseHex<unsigned_char>(&local_a8,hex_str);
  TestVector<CSHA256,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (this,&local_90,in,&local_a8);
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestSHA256(const std::string &in, const std::string &hexout) { TestVector(CSHA256(), in, ParseHex(hexout));}